

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSAPrivateKey.cpp
# Opt level: O2

bool __thiscall OSSLRSAPrivateKey::PKCS8Decode(OSSLRSAPrivateKey *this,ByteString *ber)

{
  size_t sVar1;
  PKCS8_PRIV_KEY_INFO *p8;
  EVP_PKEY *pkey;
  rsa_st *r;
  uchar *priv;
  uchar *local_28;
  
  sVar1 = ByteString::size(ber);
  if (0 < (int)(uint)sVar1) {
    local_28 = ByteString::const_byte_str(ber);
    p8 = d2i_PKCS8_PRIV_KEY_INFO
                   ((PKCS8_PRIV_KEY_INFO **)0x0,&local_28,(ulong)((uint)sVar1 & 0x7fffffff));
    if (p8 == (PKCS8_PRIV_KEY_INFO *)0x0) {
      return false;
    }
    pkey = EVP_PKCS82PKEY(p8);
    PKCS8_PRIV_KEY_INFO_free(p8);
    if (pkey != (EVP_PKEY *)0x0) {
      r = EVP_PKEY_get1_RSA(pkey);
      EVP_PKEY_free(pkey);
      if (r != (rsa_st *)0x0) {
        (**(code **)(*(long *)&this->super_RSAPrivateKey + 200))(this,r);
        RSA_free(r);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool OSSLRSAPrivateKey::PKCS8Decode(const ByteString& ber)
{
	int len = ber.size();
	if (len <= 0) return false;
	const unsigned char* priv = ber.const_byte_str();
	PKCS8_PRIV_KEY_INFO* p8 = d2i_PKCS8_PRIV_KEY_INFO(NULL, &priv, len);
	if (p8 == NULL) return false;
	EVP_PKEY* pkey = EVP_PKCS82PKEY(p8);
	PKCS8_PRIV_KEY_INFO_free(p8);
	if (pkey == NULL) return false;
	RSA* key = EVP_PKEY_get1_RSA(pkey);
	EVP_PKEY_free(pkey);
	if (key == NULL) return false;
	setFromOSSL(key);
	RSA_free(key);
	return true;
}